

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O0

void str_hash_init_sse42(void)

{
  hash_sparse = hash_sparse_sse42;
  hash_dense = hash_dense_sse42;
  str_hash_init_random();
  return;
}

Assistant:

void str_hash_init_sse42(void)
{
  hash_sparse = hash_sparse_sse42;
#if LUAJIT_SECURITY_STRHASH
  hash_dense = hash_dense_sse42;
#endif
  str_hash_init_random();
}